

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca_test.cpp
# Opt level: O0

void __thiscall LCA_LCA_Test::~LCA_LCA_Test(LCA_LCA_Test *this)

{
  LCA_LCA_Test *this_local;
  
  ~LCA_LCA_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(LCA, LCA) {
    int n = 50;
    rep(tests, 0, 10) {
        generateTree(n);
        initLCA(0, n);
        rep(a, 0, n) rep(b, 0, n) {
            int aa = a, bb = b;
            while (aa != bb) {
                if (d[aa] >= d[bb]) {
                    aa = pred[aa][0];
                } else {
                    bb = pred[bb][0];
                }
            }
            EXPECT_EQ(aa, lca(a, b));
        }
    }
}